

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O2

void __thiscall
libtorrent::mmap_disk_io::add_completed_jobs_impl
          (mmap_disk_io *this,jobqueue_t *jobs,jobqueue_t *completed)

{
  mutex *__mutex;
  disk_job *pdVar1;
  io_context *ioc;
  int iVar2;
  mmap_disk_job *j;
  disk_job *pdVar3;
  int iVar4;
  lock_guard<std::mutex> l;
  error_code eVar5;
  jobqueue_t new_jobs;
  jobqueue_t local_68;
  jobqueue_t local_48;
  
  new_jobs.m_size = 0;
  new_jobs.m_first = (disk_job *)0x0;
  new_jobs.m_last = (disk_job *)0x0;
  iVar4 = 0;
  pdVar3 = (disk_job *)jobs;
  while (pdVar3 = (pdVar3->super_tailqueue_node<libtorrent::aux::disk_job>).next,
        pdVar3 != (disk_job *)0x0) {
    if (((pdVar3->flags).m_val & 2) != 0) {
      counters::inc_stats_counter
                (this->m_stats_counters,
                 *(__index_type *)
                  ((long)&(pdVar3->action).
                          super__Variant_base<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Move_assign_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Copy_assign_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Move_ctor_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Copy_ctor_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Variant_storage_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                  + 0x50) + 0xfe,-1);
    }
    pdVar1 = pdVar3[1].super_tailqueue_node<libtorrent::aux::disk_job>.next;
    if (pdVar1 != (disk_job *)0x0) {
      iVar2 = aux::disk_job_fence::job_complete((disk_job_fence *)&pdVar1->error,pdVar3,&new_jobs);
      iVar4 = iVar4 + iVar2;
    }
  }
  counters::inc_stats_counter(this->m_stats_counters,0xfb,(long)-iVar4);
  if (((this->m_abort)._M_base._M_i & 1U) == 0) {
    if (new_jobs.m_size != 0) {
      __mutex = &this->m_job_mutex;
      ::std::mutex::lock(__mutex);
      local_48.m_first = new_jobs.m_first;
      local_48.m_last = new_jobs.m_last;
      local_48.m_size = new_jobs.m_size;
      new_jobs.m_first = (disk_job *)0x0;
      new_jobs.m_last = (disk_job *)0x0;
      new_jobs.m_size = 0;
      aux::disk_io_thread_pool::append(&this->m_generic_threads,&local_48);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      ::std::mutex::lock(__mutex);
      aux::disk_io_thread_pool::submit_jobs(&this->m_generic_threads);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  }
  else {
    while (pdVar3 = new_jobs.m_first, new_jobs.m_size != 0) {
      pdVar1 = ((new_jobs.m_first)->super_tailqueue_node<libtorrent::aux::disk_job>).next;
      if (new_jobs.m_first == new_jobs.m_last) {
        new_jobs.m_last = (disk_job *)0x0;
      }
      ((new_jobs.m_first)->super_tailqueue_node<libtorrent::aux::disk_job>).next = (disk_job *)0x0;
      new_jobs.m_size = new_jobs.m_size + -1;
      ((new_jobs.m_first)->ret).m_val = '\x01';
      new_jobs.m_first = pdVar1;
      eVar5 = boost::asio::error::make_error_code(operation_aborted);
      (pdVar3->error).ec.val_ = eVar5.val_;
      (pdVar3->error).ec.failed_ = eVar5.failed_;
      *(int3 *)&(pdVar3->error).ec.field_0x5 = eVar5._5_3_;
      (pdVar3->error).ec.cat_ = eVar5.cat_;
      *(undefined4 *)&(pdVar3->error).field_0x10 = 0xffffff;
      aux::tailqueue<libtorrent::aux::disk_job>::push_back(completed,pdVar3);
    }
  }
  ioc = this->m_ios;
  local_68.m_first = jobs->m_first;
  local_68.m_last = jobs->m_last;
  local_68.m_size = jobs->m_size;
  jobs->m_first = (disk_job *)0x0;
  jobs->m_last = (disk_job *)0x0;
  jobs->m_size = 0;
  aux::disk_completed_queue::append(&this->m_completed_jobs,ioc,&local_68);
  return;
}

Assistant:

void mmap_disk_io::add_completed_jobs_impl(jobqueue_t jobs, jobqueue_t& completed)
	{
		jobqueue_t new_jobs;
		int ret = 0;
		for (auto i = jobs.iterate(); i.get(); i.next())
		{
			auto* j = static_cast<aux::mmap_disk_job*>(i.get());
			TORRENT_ASSERT((j->flags & aux::disk_job::in_progress) || !j->storage);

			if (j->flags & aux::disk_job::fence)
			{
				m_stats_counters.inc_stats_counter(
					counters::num_fenced_read + static_cast<int>(j->get_type()), -1);
			}

			TORRENT_ASSERT(j->storage);
			if (j->storage)
				ret += j->storage->job_complete(j, new_jobs);

			TORRENT_ASSERT(ret == new_jobs.size());
			TORRENT_ASSERT(!(j->flags & aux::disk_job::in_progress));
#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(j->job_posted == false);
			j->job_posted = true;
#endif
		}

		if (ret)
		{
			DLOG("unblocked %d jobs (%d left)\n", ret
				, int(m_stats_counters[counters::blocked_disk_jobs]) - ret);
		}

		m_stats_counters.inc_stats_counter(counters::blocked_disk_jobs, -ret);
		TORRENT_ASSERT(int(m_stats_counters[counters::blocked_disk_jobs]) >= 0);

		if (m_abort.load())
		{
			while (!new_jobs.empty())
			{
				auto* j = static_cast<aux::mmap_disk_job*>(new_jobs.pop_front());
				TORRENT_ASSERT((j->flags & aux::disk_job::in_progress) || !j->storage);
				j->ret = disk_status::fatal_disk_error;
				j->error = storage_error(boost::asio::error::operation_aborted);
				completed.push_back(j);
			}
		}
		else
		{
			if (!new_jobs.empty())
			{
				{
					std::lock_guard<std::mutex> l(m_job_mutex);
					m_generic_threads.append(std::move(new_jobs));
				}

				{
					std::lock_guard<std::mutex> l(m_job_mutex);
					m_generic_threads.submit_jobs();
				}
			}
		}

		m_completed_jobs.append(m_ios, std::move(jobs));
	}